

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

bool __thiscall duckdb::Pipeline::GetProgress(Pipeline *this,ProgressData *progress)

{
  ClientContext *pCVar1;
  bool bVar2;
  PhysicalOperator *pPVar3;
  type pGVar4;
  PhysicalOperator *pPVar5;
  type pGVar6;
  ulong uVar7;
  long lVar8;
  undefined8 in_R9;
  double local_48;
  double dStack_40;
  bool local_38;
  
  pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
  uVar7 = 0x1000000000000;
  if (pPVar3->estimated_cardinality < 0x1000000000000) {
    uVar7 = pPVar3->estimated_cardinality;
  }
  lVar8 = uVar7 + (uVar7 == 0);
  if (((this->initialized)._M_base._M_i & 1U) == 0) {
    progress->done = 0.0;
    progress->total = (double)lVar8;
    bVar2 = true;
  }
  else {
    pCVar1 = this->executor->context;
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
    pGVar4 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator*(&this->source_state);
    (*pPVar3->_vptr_PhysicalOperator[0x17])(&local_48,pPVar3,pCVar1,pGVar4);
    progress->invalid = local_38;
    progress->done = local_48;
    progress->total = dStack_40;
    ProgressData::Normalize(progress,(double)lVar8);
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->sink);
    pPVar5 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->sink);
    pGVar6 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&pPVar5->sink_state);
    (*pPVar3->_vptr_PhysicalOperator[0x18])
              (&local_48,pPVar3,pCVar1,pGVar6,pPVar3->_vptr_PhysicalOperator,in_R9,
               *(undefined4 *)&progress->done,*(undefined4 *)&progress->total,
               *(undefined8 *)&progress->invalid);
    progress->invalid = local_38;
    progress->done = local_48;
    progress->total = dStack_40;
    bVar2 = ProgressData::IsValid(progress);
  }
  return bVar2;
}

Assistant:

bool Pipeline::GetProgress(ProgressData &progress) {
	D_ASSERT(source);
	idx_t source_cardinality = MinValue<idx_t>(source->estimated_cardinality, 1ULL << 48ULL);
	if (source_cardinality < 1) {
		source_cardinality = 1;
	}
	if (!initialized) {
		progress.done = 0;
		progress.total = double(source_cardinality);
		return true;
	}
	auto &client = executor.context;

	progress = source->GetProgress(client, *source_state);
	progress.Normalize(double(source_cardinality));
	progress = sink->GetSinkProgress(client, *sink->sink_state, progress);
	return progress.IsValid();
}